

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O0

int32_t T_CString_int64ToString_63(char *buffer,int64_t v,uint32_t radix)

{
  byte bVar1;
  char cVar2;
  ulong local_60;
  uint64_t uval;
  int32_t length;
  char local_48 [3];
  uint8_t digit;
  int32_t tbx;
  char tbuf [30];
  uint32_t radix_local;
  int64_t v_local;
  char *buffer_local;
  
  uval._4_4_ = 0;
  local_60 = v;
  if ((v < 0) && (radix == 10)) {
    local_60 = -v;
    uval._4_4_ = 1;
    *buffer = '-';
  }
  length = 0x1d;
  tbuf[0x15] = '\0';
  do {
    bVar1 = (byte)(local_60 % (ulong)radix);
    if (bVar1 < 10) {
      cVar2 = bVar1 + 0x30;
    }
    else {
      cVar2 = bVar1 + 0x37;
    }
    length = length + -1;
    local_48[length] = cVar2;
    local_60 = local_60 / radix;
  } while (local_60 != 0);
  strcpy(buffer + uval._4_4_,local_48 + length);
  return uval._4_4_ + (0x1d - length);
}

Assistant:

U_CAPI int32_t U_EXPORT2
T_CString_int64ToString(char* buffer, int64_t v, uint32_t radix)
{
    char      tbuf[30];
    int32_t   tbx    = sizeof(tbuf);
    uint8_t   digit;
    int32_t   length = 0;
    uint64_t  uval;
    
    U_ASSERT(radix>=2 && radix<=16);
    uval = (uint64_t) v;
    if(v<0 && radix == 10) {
        /* Only in base 10 do we conside numbers to be signed. */
        uval = (uint64_t)(-v); 
        buffer[length++] = '-';
    }
    
    tbx = sizeof(tbuf)-1;
    tbuf[tbx] = 0;   /* We are generating the digits backwards.  Null term the end. */
    do {
        digit = (uint8_t)(uval % radix);
        tbuf[--tbx] = (char)(T_CString_itosOffset(digit));
        uval  = uval / radix;
    } while (uval != 0);
    
    /* copy converted number into user buffer  */
    uprv_strcpy(buffer+length, tbuf+tbx);
    length += sizeof(tbuf) - tbx -1;
    return length;
}